

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArray<long,_false,_false>::NewInstance
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  RecyclableObject *local_b0;
  undefined1 local_80 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var object;
  byte local_51;
  Var pvStack_50;
  bool isCtorSuperCall;
  Var newTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x1aa,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  newTarget = RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x1ad,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pvStack_50 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&object,(Arguments *)&scriptContext);
  local_51 = Js::JavascriptOperators::IsConstructorSuperCall((Arguments *)&object);
  if (!(bool)local_51) {
    CVar3 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                          (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                           CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                          CallFlags_New),CallFlags_New);
    bVar2 = operator!(CVar3);
    if ((!bVar2) &&
       (pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0), pvVar8 != (Var)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x1b1,
                                  "(isCtorSuperCall || !(callInfo.Flags & CallFlags_New) || args[0] == nullptr)"
                                  ,
                                  "isCtorSuperCall || !(callInfo.Flags & CallFlags_New) || args[0] == nullptr"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  CVar3 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_New);
  bVar2 = operator!(CVar3);
  if ((!bVar2) &&
     ((pvStack_50 == (Var)0x0 ||
      (BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvStack_50), BVar4 == 0)))) {
    autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
    autoReentrancyHandler._9_7_ = 0;
    pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)newTarget);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_80,pTVar6);
    autoReentrancyHandler._8_8_ =
         Js::TypedArrayBase::CreateNewInstance
                   ((Arguments *)&scriptContext,(ScriptContext *)newTarget,8,Create);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_80);
    bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar2) {
      autoReentrancyHandler._8_8_ =
           Js::JavascriptProxy::AutoProxyWrapper((Var)autoReentrancyHandler._8_8_);
    }
    if ((local_51 & 1) == 0) {
      local_b0 = (RecyclableObject *)autoReentrancyHandler._8_8_;
    }
    else {
      constructor = VarTo<Js::RecyclableObject>(pvStack_50);
      obj = VarTo<Js::RecyclableObject>((Var)autoReentrancyHandler._8_8_);
      local_b0 = Js::JavascriptOperators::OrdinaryCreateFromConstructor
                           (constructor,obj,(DynamicObject *)0x0,(ScriptContext *)newTarget);
    }
    return local_b0;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ea00,L"[TypedArray]");
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        function->GetScriptContext()->GetThreadContext()->ProbeStack(Js::Constants::MinStackDefault, function->GetScriptContext());

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::IsConstructorSuperCall(args);
        Assert(isCtorSuperCall || !(callInfo.Flags & CallFlags_New) || args[0] == nullptr);

        if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("[TypedArray]"));
        }

        Var object = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            object = TypedArray::CreateNewInstance(args, scriptContext, sizeof(TypeName), TypedArray<TypeName, clamped, virtualAllocated>::Create);
        }
        END_SAFE_REENTRANT_CALL

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            object = Js::JavascriptProxy::AutoProxyWrapper(object);
        }
#endif
        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), VarTo<RecyclableObject>(object), nullptr, scriptContext) :
            object;
    }